

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

KFLOAT32 * __thiscall KDIS::DATA_TYPE::Vector::operator[](Vector *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  Vector *pVStack_18;
  KUINT16 i_local;
  Vector *this_local;
  
  if (i == 0) {
    this_local = (Vector *)&this->m_f32X;
  }
  else if (i == 1) {
    this_local = (Vector *)&this->m_f32Y;
  }
  else {
    if (i != 2) {
      local_1a = i;
      pVStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (Vector *)&this->m_f32Z;
  }
  return (KFLOAT32 *)this_local;
}

Assistant:

KFLOAT32 &Vector::operator[](KUINT16 i) noexcept(false)
{
    switch( i )
    {
        case 0: 	return m_f32X;
        case 1:		return m_f32Y;
        case 2:		return m_f32Z;
        default:	throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}